

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr_io.c
# Opt level: O1

int32 store_reg_mat(char *regmatfn,uint32 *veclen,uint32 n_class,uint32 n_stream,float32 ****A,
                   float32 ***B)

{
  int32 iVar1;
  FILE *__stream;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  __stream = fopen(regmatfn,"w");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
            ,0x37,"Unable to open %s to store MLLR matrices\n",regmatfn);
    iVar1 = -1;
  }
  else {
    fprintf(__stream,"%d\n",(ulong)n_class);
    fprintf(__stream,"%d\n",(ulong)n_stream);
    if (n_class != 0) {
      uVar2 = 0;
      do {
        if (n_stream != 0) {
          uVar3 = 0;
          do {
            fprintf(__stream,"%d\n",(ulong)veclen[uVar3]);
            if (veclen[uVar3] != 0) {
              uVar4 = 0;
              do {
                if (veclen[uVar3] != 0) {
                  uVar6 = 0;
                  do {
                    fprintf(__stream,"%f ",(double)(float)A[uVar2][uVar3][uVar4][uVar6]);
                    uVar6 = uVar6 + 1;
                  } while (uVar6 < veclen[uVar3]);
                }
                fputc(10,__stream);
                uVar4 = uVar4 + 1;
              } while (uVar4 < veclen[uVar3]);
            }
            if (veclen[uVar3] != 0) {
              uVar4 = 0;
              do {
                fprintf(__stream,"%f ",(double)(float)B[uVar2][uVar3][uVar4]);
                uVar4 = uVar4 + 1;
              } while (uVar4 < veclen[uVar3]);
            }
            fputc(10,__stream);
            if (veclen[uVar3] != 0) {
              uVar5 = 0;
              do {
                fwrite("1.0 ",4,1,__stream);
                uVar5 = uVar5 + 1;
              } while (uVar5 < veclen[uVar3]);
            }
            fputc(10,__stream);
            uVar3 = uVar3 + 1;
          } while (uVar3 != n_stream);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != n_class);
    }
    fclose(__stream);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int32
store_reg_mat (const char    *regmatfn,
	       const uint32  *veclen,
	       uint32  n_class,
	       uint32  n_stream,
	       float32 ****A,
	       float32 ***B)
{
    uint32 i,j,k,m;
    FILE  *fp;

    if ((fp = fopen(regmatfn,"w")) == NULL) {
	E_INFO("Unable to open %s to store MLLR matrices\n",regmatfn);
	return S3_ERROR;
    }

    fprintf(fp,"%d\n",n_class);
    fprintf(fp,"%d\n",n_stream); 
    for (m = 0; m < n_class; m++) {
	for (i = 0; i < n_stream; i++) {
	    fprintf(fp,"%d\n", veclen[i]); 
	    for (j = 0; j < veclen[i]; j++) {
		for (k = 0; k < veclen[i]; ++k) {
		    fprintf(fp,"%f ",A[m][i][j][k]);
		}
		fprintf(fp,"\n");
	    }
	    for (j = 0; j < veclen[i]; j++) {
		fprintf(fp,"%f ",B[m][i][j]);
	    }
	    fprintf(fp,"\n");
	    /* Identity transform for variances. */
	    for (j = 0; j < veclen[i]; j++) {
		fprintf(fp,"1.0 ");
	    }
	    fprintf(fp,"\n");
	}
    }
    fclose(fp);
    return S3_SUCCESS;
}